

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O3

string * __thiscall
jsoncons::uri::merge_paths_abi_cxx11_
          (string *__return_storage_ptr__,uri *this,uri *base,uri *relative)

{
  pointer pcVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  pointer pcVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  string result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  uVar2 = (this->path_part_).first;
  uVar3 = (this->path_part_).second;
  local_80 = &local_70;
  if (uVar3 == uVar2 && (this->port_part_).second != (this->userinfo_part_).first) {
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,0x821a53);
  }
  else {
    pcVar4 = (this->uri_string_)._M_dataplus._M_p;
    pcVar1 = pcVar4 + uVar2;
    uVar5 = uVar3 - uVar2;
    if (uVar5 == 0) {
LAB_0046dbeb:
      uVar7 = 0;
    }
    else {
      uVar7 = uVar5 + 1;
      pcVar6 = pcVar4 + uVar3;
      do {
        pcVar6 = pcVar6 + -1;
        if (uVar7 == 1) goto LAB_0046dbeb;
        uVar7 = uVar7 - 1;
      } while (*pcVar6 != '/');
    }
    if (uVar5 < uVar7) {
      uVar7 = uVar5;
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar1,pcVar1 + uVar7);
    std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  uVar2 = (base->path_part_).first;
  if ((base->path_part_).second != uVar2) {
    std::__cxx11::string::replace
              ((ulong)&local_80,local_78,(char *)0x0,
               (ulong)((base->uri_string_)._M_dataplus._M_p + uVar2));
  }
  if (local_80 == &local_70) {
    local_60.field_2._8_8_ = local_70._8_8_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)local_80;
  }
  local_60.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
  local_60.field_2._M_local_buf[0] = local_70._M_local_buf[0];
  local_60._M_string_length = local_78;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_80 = &local_70;
  remove_dot_segments(__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0])
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string merge_paths(const uri& base, const uri& relative)
        {
            std::string result;
            
            if (!base.encoded_authority().empty() && base.encoded_path().empty()) 
            {
                result = "/";
                //result.append(relative.encoded_path().data(), relative.encoded_path().length());
            } 
            else 
            {
                const auto& base_path = base.encoded_path();
                auto last_slash = base_path.rfind('/');
                result.append(std::string(base_path.substr(0,last_slash+1)));
            }
            if (!relative.encoded_path().empty()) 
            {
                result.append(relative.encoded_path().begin(), relative.encoded_path().end());
            }
            return remove_dot_segments(std::move(result));
        }